

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

void testing::internal::TuplePrefix<1ul>::
     ExplainMatchFailuresTo<std::tuple<testing::Matcher<std::__cxx11::string>>,std::tuple<std::__cxx11::string>>
               (tuple<testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *matchers,
               tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *values,ostream *os)

{
  bool bVar1;
  __tuple_element_t<0UL,_tuple<Matcher<internal::string>_>_> *p_Var2;
  __tuple_element_t<0UL,_tuple<basic_string<char>_>_> *p_Var3;
  ostream *poVar4;
  MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this;
  string local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  undefined1 local_200 [8];
  StringMatchResultListener listener;
  undefined1 local_58 [8];
  Value value;
  type matcher;
  ostream *os_local;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *values_local;
  tuple<testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *matchers_local;
  
  TuplePrefix<0ul>::
  ExplainMatchFailuresTo<std::tuple<testing::Matcher<std::__cxx11::string>>,std::tuple<std::__cxx11::string>>
            (matchers,values,os);
  p_Var2 = std::get<0ul,testing::Matcher<std::__cxx11::string>>(matchers);
  Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Matcher
            ((Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&value.field_2 + 8),p_Var2);
  p_Var3 = std::get<0ul,std::__cxx11::string>(values);
  std::__cxx11::string::string((string *)local_58,(string *)p_Var3);
  StringMatchResultListener::StringMatchResultListener((StringMatchResultListener *)local_200);
  std::__cxx11::string::string((string *)&local_220,(string *)local_58);
  bVar1 = MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::MatchAndExplain((MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)((long)&value.field_2 + 8),&local_220,
                            (MatchResultListener *)local_200);
  std::__cxx11::string::~string((string *)&local_220);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    poVar4 = std::operator<<(os,"  Expected arg #");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0);
    std::operator<<(poVar4,": ");
    this = &std::get<0ul,testing::Matcher<std::__cxx11::string>>(matchers)->
            super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ;
    MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    DescribeTo(this,os);
    std::operator<<(os,"\n           Actual: ");
    UniversalPrint<std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,os);
    StringMatchResultListener::str_abi_cxx11_(&local_240,(StringMatchResultListener *)local_200);
    PrintIfNotEmpty(&local_240,os);
    std::__cxx11::string::~string((string *)&local_240);
    std::operator<<(os,"\n");
  }
  StringMatchResultListener::~StringMatchResultListener((StringMatchResultListener *)local_200);
  std::__cxx11::string::~string((string *)local_58);
  Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~Matcher((Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)((long)&value.field_2 + 8));
  return;
}

Assistant:

static void ExplainMatchFailuresTo(const MatcherTuple& matchers,
                                     const ValueTuple& values,
                                     ::std::ostream* os) {
    // First, describes failures in the first N - 1 fields.
    TuplePrefix<N - 1>::ExplainMatchFailuresTo(matchers, values, os);

    // Then describes the failure (if any) in the (N - 1)-th (0-based)
    // field.
    typename tuple_element<N - 1, MatcherTuple>::type matcher =
        get<N - 1>(matchers);
    typedef typename tuple_element<N - 1, ValueTuple>::type Value;
    Value value = get<N - 1>(values);
    StringMatchResultListener listener;
    if (!matcher.MatchAndExplain(value, &listener)) {
      // TODO(wan): include in the message the name of the parameter
      // as used in MOCK_METHOD*() when possible.
      *os << "  Expected arg #" << N - 1 << ": ";
      get<N - 1>(matchers).DescribeTo(os);
      *os << "\n           Actual: ";
      // We remove the reference in type Value to prevent the
      // universal printer from printing the address of value, which
      // isn't interesting to the user most of the time.  The
      // matcher's MatchAndExplain() method handles the case when
      // the address is interesting.
      internal::UniversalPrint(value, os);
      PrintIfNotEmpty(listener.str(), os);
      *os << "\n";
    }
  }